

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryZeroIsNullWrapper,duckdb::DivideOperator,bool,false,true>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  double dVar1;
  unsigned_long *puVar2;
  int64_t iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  idx_t idx_in_entry_1;
  ulong uVar18;
  idx_t idx_in_entry;
  ulong uVar19;
  interval_t iVar20;
  interval_t iVar21;
  interval_t iVar22;
  interval_t left;
  interval_t left_00;
  interval_t left_01;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  idx_t local_78;
  ulong local_70;
  ulong local_68;
  double *local_60;
  interval_t *local_58;
  ulong local_50;
  ulong local_48;
  buffer_ptr<ValidityBuffer> *local_40;
  undefined8 local_38;
  
  local_68 = count;
  local_60 = rdata;
  local_58 = result_data;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      dVar1 = *rdata;
      lVar13 = 8;
      uVar10 = 0;
      do {
        uVar17 = *(undefined8 *)((long)ldata + lVar13 + -8);
        iVar3 = *(int64_t *)((long)&ldata->months + lVar13);
        iVar22.micros = iVar3;
        iVar22.months = (int)uVar17;
        iVar22.days = (int)((ulong)uVar17 >> 0x20);
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          left_01.micros = iVar3;
          left_01.months = (int)uVar17;
          left_01.days = (int)((ulong)uVar17 >> 0x20);
          iVar22 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                             (left_01,dVar1);
        }
        else {
          _Var9._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (_Var9._M_head_impl == (unsigned_long *)0x0) {
            local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_88,&local_78);
            p_Var7 = p_Stack_80;
            peVar6 = local_88;
            local_88 = (element_type *)0x0;
            p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
               p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
            }
            pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                               (&(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
            _Var9._M_head_impl =
                 (pTVar8->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var9._M_head_impl;
            result_data = local_58;
          }
          bVar5 = (byte)uVar10 & 0x3f;
          _Var9._M_head_impl[uVar10 >> 6] =
               _Var9._M_head_impl[uVar10 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        *(long *)((long)result_data + lVar13 + -8) = iVar22._0_8_;
        *(int64_t *)((long)&result_data->months + lVar13) = iVar22.micros;
        uVar10 = uVar10 + 1;
        lVar13 = lVar13 + 0x10;
      } while (local_68 != uVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = count + 0x3f >> 6;
    local_40 = &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    local_70 = 0;
    uVar19 = 0;
    local_50 = uVar10;
    do {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar14 = uVar19 + 0x40;
        if (local_68 <= uVar19 + 0x40) {
          uVar14 = local_68;
        }
LAB_010bceac:
        uVar15 = uVar19;
        if (uVar19 < uVar14) {
          dVar1 = *local_60;
          uVar12 = uVar19 << 4 | 8;
          do {
            uVar17 = *(undefined8 *)((long)ldata + (uVar12 - 8));
            iVar3 = *(int64_t *)((long)&ldata->months + uVar12);
            iVar21.micros = iVar3;
            iVar21.months = (int)uVar17;
            iVar21.days = (int)((ulong)uVar17 >> 0x20);
            if ((dVar1 != 0.0) || (NAN(dVar1))) {
              left_00.micros = iVar3;
              left_00.months = (int)uVar17;
              left_00.days = (int)((ulong)uVar17 >> 0x20);
              iVar21 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                 (left_00,dVar1);
            }
            else {
              _Var9._M_head_impl = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_88,&local_78);
                p_Var7 = p_Stack_80;
                peVar6 = local_88;
                local_88 = (element_type *)0x0;
                p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = peVar6;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var7;
                if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                   p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
                }
                pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                   (local_40);
                _Var9._M_head_impl =
                     (pTVar8->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                     _Var9._M_head_impl;
                result_data = local_58;
              }
              bVar5 = (byte)uVar19 & 0x3f;
              _Var9._M_head_impl[uVar19 >> 6] =
                   _Var9._M_head_impl[uVar19 >> 6] &
                   (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
            }
            *(long *)((long)result_data + (uVar12 - 8)) = iVar21._0_8_;
            *(int64_t *)((long)&result_data->months + uVar12) = iVar21.micros;
            uVar19 = uVar19 + 1;
            uVar12 = uVar12 + 0x10;
            uVar10 = local_50;
            uVar15 = uVar14;
          } while (uVar14 != uVar19);
        }
      }
      else {
        uVar12 = puVar2[local_70];
        uVar14 = uVar19 + 0x40;
        if (local_68 <= uVar19 + 0x40) {
          uVar14 = local_68;
        }
        uVar15 = uVar14;
        if (uVar12 != 0) {
          if (uVar12 == 0xffffffffffffffff) goto LAB_010bceac;
          uVar16 = uVar14 - uVar19;
          uVar15 = uVar19;
          if (uVar19 <= uVar14 && uVar16 != 0) {
            uVar11 = uVar19 << 4 | 8;
            uVar18 = 0;
            local_48 = uVar16;
            do {
              if ((uVar12 >> (uVar18 & 0x3f) & 1) != 0) {
                uVar17 = *(undefined8 *)((long)ldata + (uVar11 - 8));
                iVar3 = *(int64_t *)((long)&ldata->months + uVar11);
                dVar1 = *local_60;
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  left.micros = iVar3;
                  left.months = (int)uVar17;
                  left.days = (int)((ulong)uVar17 >> 0x20);
                  iVar20 = DivideOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                     (left,dVar1);
                  uVar16 = local_48;
                }
                else {
                  _Var9._M_head_impl =
                       (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                  if (_Var9._M_head_impl == (unsigned_long *)0x0) {
                    local_78 = (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
                    local_38 = uVar17;
                    make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                              ((duckdb *)&local_88,&local_78);
                    p_Var7 = p_Stack_80;
                    peVar6 = local_88;
                    local_88 = (element_type *)0x0;
                    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    p_Var4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = peVar6;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi = p_Var7;
                    if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                       (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                       p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
                    }
                    pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                             operator->(local_40);
                    _Var9._M_head_impl =
                         (pTVar8->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                    (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                         _Var9._M_head_impl;
                    uVar16 = local_48;
                    uVar17 = local_38;
                    result_data = local_58;
                  }
                  iVar20.micros = iVar3;
                  iVar20.months = (int)uVar17;
                  iVar20.days = (int)((ulong)uVar17 >> 0x20);
                  bVar5 = (byte)(uVar19 + uVar18) & 0x3f;
                  _Var9._M_head_impl[uVar19 + uVar18 >> 6] =
                       _Var9._M_head_impl[uVar19 + uVar18 >> 6] &
                       (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
                }
                *(long *)((long)result_data + (uVar11 - 8)) = iVar20._0_8_;
                *(int64_t *)((long)&result_data->months + uVar11) = iVar20.micros;
              }
              uVar18 = uVar18 + 1;
              uVar11 = uVar11 + 0x10;
              uVar10 = local_50;
              uVar15 = uVar14;
            } while (uVar16 != uVar18);
          }
        }
      }
      local_70 = local_70 + 1;
      uVar19 = uVar15;
    } while (local_70 != uVar10);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}